

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::InitializeModuleScopeLiveInstructions(AggressiveDCEPass *this)

{
  bool bVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  CommonDebugInfoInstructions CVar5;
  NonSemanticShaderDebugInfo100Instructions_conflict NVar6;
  DefUseManager *pDVar7;
  Instruction *pIVar8;
  IRContext *pIVar9;
  DebugInfoManager *this_00;
  Instruction *pIVar10;
  NonSemanticShaderDebugInfo100Instructions_conflict op;
  Instruction *dbg_1;
  iterator __end2_4;
  iterator __begin2_4;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_4;
  Instruction *dbg_none;
  function<void_(unsigned_int_*)> local_110;
  IRContext *local_f0;
  Instruction *dbg;
  iterator __end2_3;
  iterator __begin2_3;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_3;
  bool debug_global_seen;
  Instruction *anno;
  iterator __end2_2;
  iterator __begin2_2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_2;
  uint32_t storage_class;
  Instruction *var;
  uint32_t i;
  Instruction *entry;
  iterator __end2_1;
  iterator __begin2_1;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_1;
  Instruction *exec;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  AggressiveDCEPass *this_local;
  
  Pass::get_module((Pass *)this);
  Module::execution_modes((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&exec);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&exec), bVar1) {
    pIVar10 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    AddToWorklist(this,pIVar10);
    InstructionList::iterator::operator++(&__end2);
  }
  Pass::get_module((Pass *)this);
  Module::entry_points((Module *)&__begin2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&entry);
  while (bVar1 = utils::operator!=(&__end2_1.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&entry), bVar1)
  {
    pIVar10 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*(&__end2_1.super_iterator);
    if ((this->preserve_interface_ & 1U) == 0) {
      uVar4 = opt::Instruction::unique_id(pIVar10);
      utils::BitVector::Set(&this->live_insts_,uVar4);
      pDVar7 = Pass::get_def_use_mgr((Pass *)this);
      uVar4 = opt::Instruction::GetSingleWordInOperand(pIVar10,1);
      pIVar8 = analysis::DefUseManager::GetDef(pDVar7,uVar4);
      AddToWorklist(this,pIVar8);
      for (var._4_4_ = 3; uVar4 = opt::Instruction::NumInOperands(pIVar10), var._4_4_ < uVar4;
          var._4_4_ = var._4_4_ + 1) {
        pDVar7 = Pass::get_def_use_mgr((Pass *)this);
        uVar4 = opt::Instruction::GetSingleWordInOperand(pIVar10,var._4_4_);
        pIVar8 = analysis::DefUseManager::GetDef(pDVar7,uVar4);
        uVar4 = opt::Instruction::GetSingleWordInOperand(pIVar8,0);
        if (((this->remove_outputs_ & 1U) == 0) && (uVar4 == 3)) {
          AddToWorklist(this,pIVar8);
        }
      }
    }
    else {
      AddToWorklist(this,pIVar10);
    }
    InstructionList::iterator::operator++(&__end2_1);
  }
  Pass::get_module((Pass *)this);
  Module::annotations((Module *)&__begin2_2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&anno);
  while (bVar1 = utils::operator!=(&__end2_2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&anno), bVar1) {
    pIVar10 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*(&__end2_2.super_iterator);
    OVar3 = opt::Instruction::opcode(pIVar10);
    if (OVar3 == OpDecorate) {
      uVar4 = opt::Instruction::GetSingleWordInOperand(pIVar10,1);
      if ((uVar4 == 0xb) &&
         (uVar4 = opt::Instruction::GetSingleWordInOperand(pIVar10,2), uVar4 == 0x19)) {
        AddToWorklist(this,pIVar10);
      }
      pIVar9 = Pass::context((Pass *)this);
      bVar1 = IRContext::preserve_bindings(pIVar9);
      if ((bVar1) &&
         ((uVar4 = opt::Instruction::GetSingleWordInOperand(pIVar10,1), uVar4 == 0x22 ||
          (uVar4 = opt::Instruction::GetSingleWordInOperand(pIVar10,1), uVar4 == 0x21)))) {
        AddToWorklist(this,pIVar10);
      }
      pIVar9 = Pass::context((Pass *)this);
      bVar1 = IRContext::preserve_spec_constants(pIVar9);
      if ((bVar1) && (uVar4 = opt::Instruction::GetSingleWordInOperand(pIVar10,1), uVar4 == 1)) {
        AddToWorklist(this,pIVar10);
      }
    }
    InstructionList::iterator::operator++(&__end2_2);
  }
  bVar1 = false;
  Pass::get_module((Pass *)this);
  Module::ext_inst_debuginfo((Module *)&__begin2_3);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_3);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&dbg);
  while (bVar2 = utils::operator!=(&__end2_3.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&dbg), bVar2) {
    local_f0 = (IRContext *)
               utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&__end2_3.super_iterator);
    CVar5 = opt::Instruction::GetCommonDebugOpcode((Instruction *)local_f0);
    pIVar9 = local_f0;
    if (CVar5 == CommonDebugInfoDebugGlobalVariable) {
      bVar1 = true;
      dbg_none = (Instruction *)this;
      std::function<void(unsigned_int*)>::
      function<spvtools::opt::AggressiveDCEPass::InitializeModuleScopeLiveInstructions()::__0,void>
                ((function<void(unsigned_int*)> *)&local_110,(anon_class_8_1_8991fb9c *)&dbg_none);
      opt::Instruction::ForEachInId((Instruction *)pIVar9,&local_110);
      std::function<void_(unsigned_int_*)>::~function(&local_110);
    }
    InstructionList::iterator::operator++(&__end2_3);
  }
  if (bVar1) {
    pIVar9 = Pass::context((Pass *)this);
    this_00 = IRContext::get_debug_info_mgr(pIVar9);
    pIVar10 = analysis::DebugInfoManager::GetDebugInfoNone(this_00);
    AddToWorklist(this,pIVar10);
  }
  Pass::get_module((Pass *)this);
  Module::ext_inst_debuginfo((Module *)&__begin2_4);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_4);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&dbg_1);
  while (bVar1 = utils::operator!=(&__end2_4.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&dbg_1), bVar1)
  {
    pIVar10 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*(&__end2_4.super_iterator);
    NVar6 = opt::Instruction::GetShader100DebugOpcode(pIVar10);
    if ((((NVar6 == NonSemanticShaderDebugInfo100DebugCompilationUnit) ||
         (NVar6 == NonSemanticShaderDebugInfo100DebugEntryPoint)) ||
        (NVar6 == NonSemanticShaderDebugInfo100DebugSource)) ||
       (NVar6 == NonSemanticShaderDebugInfo100DebugSourceContinued)) {
      AddToWorklist(this,pIVar10);
    }
    InstructionList::iterator::operator++(&__end2_4);
  }
  return;
}

Assistant:

void AggressiveDCEPass::InitializeModuleScopeLiveInstructions() {
  // Keep all execution modes.
  for (auto& exec : get_module()->execution_modes()) {
    AddToWorklist(&exec);
  }
  // Keep all entry points.
  for (auto& entry : get_module()->entry_points()) {
    if (!preserve_interface_) {
      live_insts_.Set(entry.unique_id());
      // The actual function is live always.
      AddToWorklist(
          get_def_use_mgr()->GetDef(entry.GetSingleWordInOperand(1u)));
      for (uint32_t i = 3; i < entry.NumInOperands(); ++i) {
        auto* var = get_def_use_mgr()->GetDef(entry.GetSingleWordInOperand(i));
        auto storage_class = var->GetSingleWordInOperand(0u);
        // Vulkan support outputs without an associated input, but not inputs
        // without an associated output. Don't remove outputs unless explicitly
        // allowed.
        if (!remove_outputs_ &&
            spv::StorageClass(storage_class) == spv::StorageClass::Output) {
          AddToWorklist(var);
        }
      }
    } else {
      AddToWorklist(&entry);
    }
  }
  for (auto& anno : get_module()->annotations()) {
    if (anno.opcode() == spv::Op::OpDecorate) {
      // Keep workgroup size.
      if (spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
              spv::Decoration::BuiltIn &&
          spv::BuiltIn(anno.GetSingleWordInOperand(2u)) ==
              spv::BuiltIn::WorkgroupSize) {
        AddToWorklist(&anno);
      }

      if (context()->preserve_bindings()) {
        // Keep all bindings.
        if ((spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
             spv::Decoration::DescriptorSet) ||
            (spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
             spv::Decoration::Binding)) {
          AddToWorklist(&anno);
        }
      }

      if (context()->preserve_spec_constants()) {
        // Keep all specialization constant instructions
        if (spv::Decoration(anno.GetSingleWordInOperand(1u)) ==
            spv::Decoration::SpecId) {
          AddToWorklist(&anno);
        }
      }
    }
  }

  // For each DebugInfo GlobalVariable keep all operands except the Variable.
  // Later, if the variable is killed with KillInst(), we will set the operand
  // to DebugInfoNone. Create and save DebugInfoNone now for this possible
  // later use. This is slightly unoptimal, but it avoids generating it during
  // instruction killing when the module is not consistent.
  bool debug_global_seen = false;
  for (auto& dbg : get_module()->ext_inst_debuginfo()) {
    if (dbg.GetCommonDebugOpcode() != CommonDebugInfoDebugGlobalVariable)
      continue;
    debug_global_seen = true;
    dbg.ForEachInId([this](const uint32_t* iid) {
      Instruction* in_inst = get_def_use_mgr()->GetDef(*iid);
      if (in_inst->opcode() == spv::Op::OpVariable) return;
      AddToWorklist(in_inst);
    });
  }
  if (debug_global_seen) {
    auto dbg_none = context()->get_debug_info_mgr()->GetDebugInfoNone();
    AddToWorklist(dbg_none);
  }

  // Add top level DebugInfo to worklist
  for (auto& dbg : get_module()->ext_inst_debuginfo()) {
    auto op = dbg.GetShader100DebugOpcode();
    if (op == NonSemanticShaderDebugInfo100DebugCompilationUnit ||
        op == NonSemanticShaderDebugInfo100DebugEntryPoint ||
        op == NonSemanticShaderDebugInfo100DebugSource ||
        op == NonSemanticShaderDebugInfo100DebugSourceContinued) {
      AddToWorklist(&dbg);
    }
  }
}